

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

QRect __thiscall
QMdiAreaPrivate::resizeToMinimumTileSize
          (QMdiAreaPrivate *this,QSize *minSubWindowSize,int subWindowCount)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  QWidget *this_00;
  QWidgetData *pQVar9;
  undefined1 auVar10 [16];
  int iVar11;
  QStyle *pQVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  QWidget *this_01;
  long in_FS_OFFSET;
  bool bVar21;
  double dVar22;
  QSize local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((subWindowCount < 1) || (iVar17 = (minSubWindowSize->wd).m_i, iVar17 < 0)) ||
     (iVar15 = (minSubWindowSize->ht).m_i, iVar15 < 0)) {
    pQVar9 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
    uVar19 = (pQVar9->crect).x2.m_i - (pQVar9->crect).x1.m_i;
    uVar16 = (ulong)(uint)((pQVar9->crect).y2.m_i - (pQVar9->crect).y1.m_i);
  }
  else {
    this_00 = *(QWidget **)
               &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
                field_0x8;
    dVar22 = ceil(SQRT((double)subWindowCount));
    uVar19 = 1;
    if (1 < (int)dVar22) {
      uVar19 = (int)dVar22;
    }
    bVar21 = (uint)subWindowCount % uVar19 != 0;
    iVar17 = iVar17 * uVar19;
    iVar15 = iVar15 * ((uint)subWindowCount / uVar19 + (uint)bVar21 +
                      (uint)((uint)subWindowCount / uVar19 + (uint)bVar21 == 0));
    this_01 = this_00;
    if (this->tileCalledFromResizeEvent == false) {
      for (; this_01 != (QWidget *)0x0; this_01 = *(QWidget **)(*(long *)&this_01->field_0x8 + 0x10)
          ) {
        uVar19 = (this_01->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                 super_QFlagsStorage<Qt::WindowType>.i;
        if (((uVar19 & 1) != 0) || ((uVar19 & 0xff) == 0x12)) goto LAB_00440a33;
      }
      this_01 = (QWidget *)0x0;
LAB_00440a33:
      iVar14 = (this->super_QAbstractScrollAreaPrivate).bottom +
               (this->super_QAbstractScrollAreaPrivate).top + iVar15 + 2;
      pQVar9 = (((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider).
               super_QWidget.data;
      if ((pQVar9->widget_attributes & 0x8000) != 0) {
        iVar14 = ((iVar14 + (pQVar9->crect).y2.m_i) - (pQVar9->crect).y1.m_i) + 1;
      }
      iVar18 = (this->super_QAbstractScrollAreaPrivate).right +
               (this->super_QAbstractScrollAreaPrivate).left + iVar17 + 2;
      pQVar9 = (((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider).
               super_QWidget.data;
      if ((pQVar9->widget_attributes & 0x8000) != 0) {
        iVar18 = ((iVar18 + (pQVar9->crect).x2.m_i) - (pQVar9->crect).x1.m_i) + 1;
      }
      pQVar12 = QWidget::style(this_00);
      iVar11 = (**(code **)(*(long *)pQVar12 + 0xf0))(pQVar12,0x11,0,this_00,0);
      if (iVar11 != 0) {
        pQVar12 = QWidget::style(this_00);
        iVar11 = (**(code **)(*(long *)pQVar12 + 0xe0))(pQVar12,5,0,this_00);
        iVar18 = iVar18 + iVar11 * 2;
        iVar14 = iVar14 + iVar11 * 2;
      }
      pQVar9 = this_00->data;
      iVar11 = ((pQVar9->crect).y2.m_i - (pQVar9->crect).y1.m_i) + 1;
      if (iVar14 <= iVar11) {
        iVar14 = iVar11;
      }
      if ((this->super_QAbstractScrollAreaPrivate).hbarpolicy == ScrollBarAlwaysOff) {
        iVar13 = ((pQVar9->crect).x2.m_i - (pQVar9->crect).x1.m_i) + 1;
        if (iVar18 <= iVar13) {
          iVar18 = iVar13;
        }
        pQVar9 = this_01->data;
        uVar1 = (pQVar9->crect).x2;
        uVar5 = (pQVar9->crect).y2;
        uVar2 = (pQVar9->crect).x1;
        uVar6 = (pQVar9->crect).y1;
        local_40.wd.m_i = ((iVar18 - iVar13) + 1 + uVar1) - uVar2;
        local_40.ht.m_i = (uVar5 + 1) - uVar6;
        QWidget::resize(this_01,&local_40);
      }
      if ((this->super_QAbstractScrollAreaPrivate).vbarpolicy == ScrollBarAlwaysOff) {
        pQVar9 = this_01->data;
        uVar3 = (pQVar9->crect).x2;
        uVar7 = (pQVar9->crect).y2;
        uVar4 = (pQVar9->crect).x1;
        uVar8 = (pQVar9->crect).y1;
        local_40.wd.m_i = (uVar3 + 1) - uVar4;
        local_40.ht.m_i = ((iVar14 - iVar11) + 1 + uVar7) - uVar8;
        QWidget::resize(this_01,&local_40);
      }
    }
    pQVar9 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
    uVar19 = (pQVar9->crect).x2.m_i - (pQVar9->crect).x1.m_i;
    uVar20 = (pQVar9->crect).y2.m_i - (pQVar9->crect).y1.m_i;
    if ((int)(uVar19 + 1) < iVar17) {
      uVar19 = iVar17 - 1;
      if ((this->super_QAbstractScrollAreaPrivate).hbarpolicy == ScrollBarAlwaysOff) {
        QAbstractScrollArea::setHorizontalScrollBarPolicy
                  ((QAbstractScrollArea *)this_00,ScrollBarAsNeeded);
      }
      else {
        QAbstractSlider::setValue
                  (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,0);
      }
    }
    if ((int)(uVar20 + 1) < iVar15) {
      uVar16 = (ulong)(iVar15 - 1);
      if ((this->super_QAbstractScrollAreaPrivate).vbarpolicy == ScrollBarAlwaysOff) {
        QAbstractScrollArea::setVerticalScrollBarPolicy
                  ((QAbstractScrollArea *)this_00,ScrollBarAsNeeded);
      }
      else {
        QAbstractSlider::setValue
                  (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,0);
      }
    }
    else {
      uVar16 = (ulong)uVar20;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  auVar10._8_8_ = 0;
  auVar10._0_8_ = (ulong)uVar19 | uVar16 << 0x20;
  return (QRect)(auVar10 << 0x40);
}

Assistant:

QRect QMdiAreaPrivate::resizeToMinimumTileSize(const QSize &minSubWindowSize, int subWindowCount)
{
    Q_Q(QMdiArea);
    if (!minSubWindowSize.isValid() || subWindowCount <= 0)
        return viewport->rect();

    // Calculate minimum size.
    const int columns = qMax(qCeil(qSqrt(qreal(subWindowCount))), 1);
    const int rows = qMax((subWindowCount % columns) ? (subWindowCount / columns + 1)
                                                     : (subWindowCount / columns), 1);
    const int minWidth = minSubWindowSize.width() * columns;
    const int minHeight = minSubWindowSize.height() * rows;

    // Increase area size if necessary. Scroll bars are provided if we're not able
    // to resize to the minimum size.
    if (!tileCalledFromResizeEvent) {
        QWidget *topLevel = q;
        // Find the topLevel for this area, either a real top-level or a sub-window.
        while (topLevel && !topLevel->isWindow() && topLevel->windowType() != Qt::SubWindow)
            topLevel = topLevel->parentWidget();
        // We don't want sub-subwindows to be placed at the edge, thus add 2 pixels.
        int minAreaWidth = minWidth + left + right + 2;
        int minAreaHeight = minHeight + top + bottom + 2;
        if (hbar->isVisible())
            minAreaHeight += hbar->height();
        if (vbar->isVisible())
            minAreaWidth += vbar->width();
        if (q->style()->styleHint(QStyle::SH_ScrollView_FrameOnlyAroundContents, nullptr, q)) {
            const int frame = q->style()->pixelMetric(QStyle::PM_DefaultFrameWidth, nullptr, q);
            minAreaWidth += 2 * frame;
            minAreaHeight += 2 * frame;
        }
        const QSize diff = QSize(minAreaWidth, minAreaHeight).expandedTo(q->size()) - q->size();
        // Only resize topLevel widget if scroll bars are disabled.
        if (hbarpolicy == Qt::ScrollBarAlwaysOff)
            topLevel->resize(topLevel->size().width() + diff.width(), topLevel->size().height());
        if (vbarpolicy == Qt::ScrollBarAlwaysOff)
            topLevel->resize(topLevel->size().width(), topLevel->size().height() + diff.height());
    }

    QRect domain = viewport->rect();

    // Adjust domain width and provide horizontal scroll bar.
    if (domain.width() < minWidth) {
        domain.setWidth(minWidth);
        if (hbarpolicy == Qt::ScrollBarAlwaysOff)
            q->setHorizontalScrollBarPolicy(Qt::ScrollBarAsNeeded);
        else
            hbar->setValue(0);
    }
    // Adjust domain height and provide vertical scroll bar.
    if (domain.height() < minHeight) {
        domain.setHeight(minHeight);
        if (vbarpolicy  == Qt::ScrollBarAlwaysOff)
            q->setVerticalScrollBarPolicy(Qt::ScrollBarAsNeeded);
        else
            vbar->setValue(0);
    }
    return domain;
}